

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2612intf.c
# Opt level: O0

UINT8 device_start_ym2612_gens(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  ym2612_ *devData_00;
  UINT32 local_2c;
  UINT32 rate;
  DEV_DATA *devData;
  ym2612_ *chip;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  local_2c = cfg->clock / 0x90;
  if ((cfg->srMode == '\x01') || ((cfg->srMode == '\x02' && (local_2c < cfg->smplRate)))) {
    local_2c = cfg->smplRate;
  }
  devData_00 = YM2612_Init(cfg->clock,local_2c,'\0');
  devData_00->_devData = (DEV_DATA)devData_00;
  INIT_DEVINF(retDevInf,&devData_00->_devData,local_2c,&devDef_Gens);
  return '\0';
}

Assistant:

static UINT8 device_start_ym2612_gens(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	ym2612_* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 2 / 72;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = YM2612_Init(cfg->clock, rate, 0);
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_Gens);
	return 0x00;
}